

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apx_node_main.c
# Opt level: O2

int main(int argc,char **argv)

{
  byte bVar1;
  FILE *__stream;
  uint uVar2;
  int iVar3;
  uint uVar4;
  undefined8 uVar5;
  long lVar6;
  adt_str_t *paVar7;
  apx_nodeInstance_t *paVar8;
  char *pcVar9;
  __sighandler_t p_Var10;
  uint8_t addressFamily;
  uint16_t dummy_port;
  sigset_t oldmask;
  
  m_bind_port = 0x13ec;
  m_connect_port = 5000;
  adt_str_create(&m_definition_file);
  uVar2 = argparse_exec(argc,argv,argparse_cbk);
  if (uVar2 != 0) {
    printf("Error parsing argument (%d)\n",(ulong)uVar2);
LAB_00102949:
    iVar3 = 0;
    print_usage(*argv);
    goto LAB_00102951;
  }
  if ((m_bind_resource_type == '\0') &&
     ((m_bind_resource_type =
            apx_parse_resource_name("/tmp/apx_node.socket",&m_bind_address,&dummy_port),
      m_bind_resource_type == '\x05' || (m_bind_resource_type == '\0')))) {
    __assert_fail("(m_bind_resource_type != APX_RESOURCE_TYPE_UNKNOWN) && (m_bind_resource_type != APX_RESOURCE_TYPE_ERROR)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/app/apx_node/src/apx_node_main.c"
                  ,0x89,"int main(int, char **)");
  }
  if ((m_connect_resource_type == '\0') &&
     ((m_connect_resource_type =
            apx_parse_resource_name("/tmp/apx_server.socket",&m_connect_address,&dummy_port),
      m_connect_resource_type == '\x05' || (m_connect_resource_type == '\0')))) {
    __assert_fail("(m_connect_resource_type != APX_RESOURCE_TYPE_UNKNOWN) && (m_connect_resource_type != APX_RESOURCE_TYPE_ERROR)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/app/apx_node/src/apx_node_main.c"
                  ,0x90,"int main(int, char **)");
  }
  if (m_display_version == '\x01') {
    printf("%s %s\n","apx_node","0.3.1");
  }
  if (m_display_help == '\x01') {
    print_usage(*argv);
  }
  iVar3 = adt_str_length(&m_definition_file);
  if (iVar3 == 0) {
    iVar3 = 0;
    if ((m_display_version != '\0') || (m_display_help != '\0')) goto LAB_00102951;
    puts("Error: No definition file given");
    goto LAB_00102949;
  }
  printf("Initializing APX connection...");
  m_apx_connection = apx_connection_new();
  if (m_apx_connection == (apx_connection_t *)0x0) {
    puts("Failed");
LAB_00102c69:
    iVar3 = 1;
    goto LAB_00102951;
  }
  puts("OK");
  uVar5 = adt_str_cstr(&m_definition_file);
  lVar6 = ifstream_util_readTextFile(uVar5);
  if (lVar6 == 0) {
    uVar5 = adt_str_cstr(&m_definition_file);
    printf("Failed to read text file: %s\n",uVar5);
LAB_00102e46:
    __stream = _stderr;
    m_apx_definition_str = (adt_str_t *)0x0;
    uVar5 = adt_str_cstr(&m_definition_file);
    fprintf(__stream,"Error: Could not read file \'%s\'\n",uVar5);
    goto LAB_00102c69;
  }
  paVar7 = (adt_str_t *)adt_str_new_bytearray(lVar6);
  adt_bytearray_delete(lVar6);
  if (paVar7 == (adt_str_t *)0x0) {
    puts("Failed to create string from bytearray");
    goto LAB_00102e46;
  }
  m_apx_definition_str = paVar7;
  uVar5 = adt_str_cstr(&m_definition_file);
  uVar2 = adt_str_size(m_apx_definition_str);
  printf("Parsing %s (%d bytes)...",uVar5,(ulong)uVar2);
  uVar2 = apx_connection_attachNode(m_apx_connection,m_apx_definition_str);
  if (uVar2 != 0) {
    if (uVar2 == 3) {
      uVar2 = apx_connection_getLastErrorLine(m_apx_connection);
      puts("Failed");
      pcVar9 = "Error: Parse error on line %d\n";
    }
    else {
      puts("Failed");
      pcVar9 = "Error: attach node failed with error code %d\n";
    }
    fprintf(_stderr,pcVar9,(ulong)uVar2);
    return 1;
  }
  puts("OK");
  paVar8 = apx_connection_getLastAttachedNode(m_apx_connection);
  if (paVar8 != (apx_nodeInstance_t *)0x0) {
    uVar2 = apx_nodeInstance_get_num_provide_ports(paVar8);
    uVar4 = apx_nodeInstance_get_num_require_ports(paVar8);
    uVar5 = apx_nodeInstance_get_name(paVar8);
    printf("\t%s: Provide-Ports: %d, Require-Ports: %d\n",uVar5,(ulong)uVar2,(ulong)uVar4);
  }
  uVar5 = adt_str_cstr(m_connect_address);
  printf("Connecting to APX server at %s...",uVar5);
  pcVar9 = (char *)adt_str_cstr(m_connect_address);
  uVar2 = 1;
  switch(m_connect_resource_type) {
  case '\x01':
LAB_00102cb3:
    uVar2 = apx_connection_connect_tcp(m_apx_connection,pcVar9,m_connect_port);
    goto LAB_00102cb8;
  case '\x02':
    uVar2 = 0xb;
    break;
  case '\x03':
    uVar2 = apx_connection_connect_unix(m_apx_connection,pcVar9);
LAB_00102cb8:
    if (uVar2 != 0) break;
    puts("OK");
    if (m_no_bind != '\0') goto LAB_00102cdb;
    bVar1 = 0;
    printf("Initializing JSON message server...");
    pcVar9 = (char *)adt_str_cstr(m_bind_address);
    uVar2 = 0x22;
    addressFamily = '\x02';
    switch(m_bind_resource_type) {
    case '\x01':
      break;
    case '\x02':
      addressFamily = '\n';
      break;
    case '\x03':
      bVar1 = 1;
    case '\x04':
      if (*pcVar9 != '\0') {
        iVar3 = strcmp(pcVar9,"localhost");
        if (!(bool)(bVar1 | iVar3 == 0)) goto switchD_00102c18_default;
        addressFamily = (iVar3 == 0) + '\x01';
      }
      break;
    default:
      goto switchD_00102c18_default;
    }
    uVar2 = json_server_init(m_apx_connection,addressFamily);
    if (uVar2 == 0) {
      puts("OK");
      uVar5 = adt_str_cstr(m_bind_address);
      printf("Starting JSON message server at \"%s\"...",uVar5);
      pcVar9 = (char *)adt_str_cstr(m_bind_address);
      uVar4 = (uint)m_bind_resource_type;
      if (uVar4 - 1 < 2) {
LAB_00102f77:
        uVar2 = json_server_start_tcp(pcVar9,m_bind_port);
      }
      else {
        if (uVar4 != 3) {
          uVar2 = 1;
          if ((uVar4 != 4) ||
             ((*pcVar9 != '\0' && (iVar3 = strcmp(pcVar9,"localhost"), iVar3 != 0)))) break;
          pcVar9 = "127.0.0.1";
          goto LAB_00102f77;
        }
        uVar2 = json_server_start_unix(pcVar9);
      }
      if (uVar2 == 0) {
        puts("OK");
        m_messageServerRunning = '\x01';
LAB_00102cdb:
        p_Var10 = signal(2,signal_handler);
        if (p_Var10 == (__sighandler_t)0x1) {
          signal(2,(__sighandler_t)0x1);
        }
        p_Var10 = signal(0xf,signal_handler);
        if (p_Var10 == (__sighandler_t)0x1) {
          signal(0xf,(__sighandler_t)0x1);
        }
        sigemptyset((sigset_t *)&dummy_port);
        sigaddset((sigset_t *)&dummy_port,2);
        sigaddset((sigset_t *)&dummy_port,0xf);
        sigprocmask(0,(sigset_t *)&dummy_port,(sigset_t *)&oldmask);
        while (m_runFlag == '\0') {
          sigsuspend((sigset_t *)&oldmask);
        }
        iVar3 = 0;
        sigprocmask(1,(sigset_t *)&dummy_port,(sigset_t *)0x0);
        goto LAB_00102951;
      }
    }
    break;
  case '\x04':
    if ((*pcVar9 == '\0') || (iVar3 = strcmp(pcVar9,"localhost"), iVar3 == 0)) {
      pcVar9 = "127.0.0.1";
      goto LAB_00102cb3;
    }
  }
switchD_00102c18_default:
  iVar3 = 0;
  printf("Failed (%d)\n",(ulong)uVar2);
LAB_00102951:
  if (m_messageServerRunning == '\x01') {
    printf("Shutting down JSON message server...");
    json_server_shutdown();
    puts("OK");
  }
  if (m_apx_connection != (apx_connection_t *)0x0) {
    printf("Closing APX connection...");
    apx_connection_disconnect(m_apx_connection);
    apx_connection_delete(m_apx_connection);
    puts("OK");
  }
  adt_str_destroy(&m_definition_file);
  if (m_bind_address != (adt_str_t *)0x0) {
    adt_str_delete();
  }
  if (m_connect_address != (adt_str_t *)0x0) {
    adt_str_delete();
  }
  if (m_apx_definition_str != (adt_str_t *)0x0) {
    adt_str_delete();
  }
  return iVar3;
}

Assistant:

int main(int argc, char **argv)
{
   m_bind_port = bind_port_default;
   m_connect_port = connect_port_default;
   adt_str_create(&m_definition_file);
   int retval = 0;
   argparse_result_t result = argparse_exec(argc, (const char**) argv, argparse_cbk);
   if (result == ARGPARSE_SUCCESS)
   {
#ifdef _WIN32
      if (init_wsa() != 0)
      {
         int err = WSAGetLastError();
         fprintf(stderr, "WSAStartup failed with error: %d\n", err);
         retval = 1;
         goto SHUTDOWN;
      }
#endif
      if (m_bind_resource_type == APX_RESOURCE_TYPE_UNKNOWN)
      {
         uint16_t dummy_port;
         m_bind_resource_type = apx_parse_resource_name(m_bind_address_default, &m_bind_address, &dummy_port);
         (void) dummy_port;
         assert( (m_bind_resource_type != APX_RESOURCE_TYPE_UNKNOWN) && (m_bind_resource_type != APX_RESOURCE_TYPE_ERROR) );
      }
      if (m_connect_resource_type == APX_RESOURCE_TYPE_UNKNOWN)
      {
         uint16_t dummy_port;
         m_connect_resource_type = apx_parse_resource_name(m_connect_address_default, &m_connect_address, &dummy_port);
         (void) dummy_port;
         assert( (m_connect_resource_type != APX_RESOURCE_TYPE_UNKNOWN) && (m_connect_resource_type != APX_RESOURCE_TYPE_ERROR) );
      }
      if (m_display_version)
      {
         print_version();
      }
      if (m_display_help)
      {
         print_usage(argv[0]);
      }
      if (adt_str_length(&m_definition_file) == 0)
      {
         if (!m_display_version && !m_display_help)
         {
            printf("Error: No definition file given\n");
            print_usage(argv[0]);
         }
      }
      else
      {
         printf("Initializing APX connection...");
         m_apx_connection = apx_connection_new();
         if (m_apx_connection != 0)
         {
            printf("OK\n");
         }
         else
         {
            printf("Failed\n");
            retval = 1;
            goto SHUTDOWN;
         }
         m_apx_definition_str = read_definition_file(&m_definition_file);
         if (m_apx_definition_str != 0)
         {
            printf("Parsing %s (%d bytes)...", adt_str_cstr(&m_definition_file), adt_str_size(m_apx_definition_str));
            apx_error_t rc = apx_connection_attachNode(m_apx_connection, m_apx_definition_str);
            if (rc != APX_NO_ERROR)
            {
               if (rc == APX_PARSE_ERROR)
               {
                  int32_t errorLine = apx_connection_getLastErrorLine(m_apx_connection);
                  printf("Failed\n");
                  fprintf(stderr, "Error: Parse error on line %d\n", (int) errorLine);
               }
               else
               {
                  printf("Failed\n");
                  fprintf(stderr, "Error: attach node failed with error code %d\n", (int) rc);
               }
               return 1;
            }
            else
            {
               apx_nodeInstance_t *node_instance;
               apx_portCount_t num_provide_ports;
               apx_portCount_t num_require_ports;
               printf("OK\n");
               node_instance = apx_connection_getLastAttachedNode(m_apx_connection);
               if (node_instance != 0)
               {
                  num_provide_ports = apx_nodeInstance_get_num_provide_ports(node_instance);
                  num_require_ports = apx_nodeInstance_get_num_require_ports(node_instance);
                  printf("\t%s: Provide-Ports: %d, Require-Ports: %d\n",
                        apx_nodeInstance_get_name(node_instance),
                        (int) num_provide_ports, (int) num_require_ports);
               }
               printf("Connecting to APX server at %s...", adt_str_cstr(m_connect_address));
               rc = connect_to_apx_server();
               if (rc == APX_NO_ERROR)
               {
#ifndef _WIN32
                  sigset_t mask, oldmask;
#endif
                  printf("OK\n");
                  if (!m_no_bind)
                  {                     
                     printf("Initializing JSON message server...");
                     rc = init_json_message_server();
                     if (rc == APX_NO_ERROR)
                     {
                        printf("OK\n");
                     }
                     else
                     {
                        printf("Failed (%d)\n", (int) rc);
                        goto SHUTDOWN;
                     }
                     printf("Starting JSON message server at \"%s\"...", adt_str_cstr(m_bind_address));
                     rc = start_json_message_server();
                     if (rc == APX_NO_ERROR)
                     {
                        printf("OK\n");
                        m_messageServerRunning = true;
                     }
                     else
                     {
                        printf("Failed (%d)\n", (int) rc);
                        goto SHUTDOWN;
                     }
                  }
#ifdef _WIN32
                  while(m_runFlag)
                  {
                     SLEEP(1);
                  }
#else
                  signal_handler_setup();
                  sigemptyset(&mask);
                  sigaddset(&mask, SIGINT);
                  sigaddset(&mask, SIGTERM);
                  sigprocmask(SIG_BLOCK, &mask, &oldmask);
                  while(m_runFlag)
                  {
                     sigsuspend(&oldmask);
                  }
                  sigprocmask(SIG_UNBLOCK, &mask, NULL);
#endif
               }
               else
               {
                  printf("Failed (%d)\n", (int) rc);
               }
            }
         }
         else
         {
            fprintf(stderr, "Error: Could not read file '%s'\n", adt_str_cstr(&m_definition_file));
            retval = 1;
            goto SHUTDOWN;
         }
      }
   }
   else
   {
      printf("Error parsing argument (%d)\n", (int) result);
      print_usage(argv[0]);
   }
SHUTDOWN:
   application_shutdown();
   application_cleanup();
   return retval;
}